

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

BigNum * operator+(BigNum *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  iterator iVar1;
  pointer piVar2;
  pointer piVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int rest;
  int sum;
  BigNum b_3;
  BigNum b_1;
  BigNum b_4;
  BigNum b_2;
  int local_154;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  BigNum::BigNum(__return_storage_ptr__);
  local_154 = 0;
  if (a->sign == b->sign) {
    if (a->length < b->length) {
      iVar5 = b->length;
      if (a->length < iVar5) {
        iVar6 = 0;
        do {
          local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          iVar1._M_current =
               (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&a->digits,iVar1,(int *)&local_150);
          }
          else {
            *iVar1._M_current = 0;
            (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          iVar6 = iVar6 + 1;
          iVar5 = b->length;
        } while (iVar6 < iVar5 - a->length);
      }
      a->length = iVar5;
    }
    if (b->length < a->length) {
      iVar5 = a->length;
      if (b->length < iVar5) {
        iVar6 = 0;
        do {
          local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          iVar1._M_current =
               (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&b->digits,iVar1,(int *)&local_150);
          }
          else {
            *iVar1._M_current = 0;
            (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          iVar6 = iVar6 + 1;
          iVar5 = a->length;
        } while (iVar6 < iVar5 - b->length);
      }
      b->length = iVar5;
    }
    iVar5 = a->length;
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        piVar2 = (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (piVar3[lVar7] + piVar2[lVar7] + local_154) % 10;
        local_154 = (local_154 + piVar2[lVar7] + piVar3[lVar7]) / 10;
        iVar1._M_current =
             (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,
                     (int *)&local_150);
        }
        else {
          *iVar1._M_current =
               (int)local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        lVar7 = lVar7 + 1;
        iVar5 = a->length;
      } while (lVar7 < iVar5);
    }
    __return_storage_ptr__->sign = a->sign;
    __return_storage_ptr__->length = iVar5;
    if (0 < local_154) {
      iVar1._M_current =
           (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,&local_154);
      }
      else {
        *iVar1._M_current = local_154;
        (__return_storage_ptr__->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      __return_storage_ptr__->length = __return_storage_ptr__->length + 1;
    }
  }
  else {
    if (a->sign == false) {
      BigNum::BigNum(&local_b0,b);
      BigNum::BigNum(&local_130,&local_b0);
      local_130.sign = true;
      BigNum::BigNum(&local_f0,a);
      BigNum::BigNum(&local_d0,&local_f0);
      local_d0.sign = true;
      operator-(&local_150,&local_130,&local_d0);
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->digits,&local_150.digits);
      __return_storage_ptr__->sign = local_150.sign;
      __return_storage_ptr__->length = local_150.length;
      pvVar4 = (void *)CONCAT44(local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
      }
      if (local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
    }
    else {
      BigNum::BigNum(&local_50,a);
      BigNum::BigNum(&local_110,&local_50);
      local_110.sign = true;
      BigNum::BigNum(&local_90,b);
      BigNum::BigNum(&local_70,&local_90);
      local_70.sign = true;
      operator-(&local_150,&local_110,&local_70);
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->digits,&local_150.digits);
      __return_storage_ptr__->sign = local_150.sign;
      __return_storage_ptr__->length = local_150.length;
      pvVar4 = (void *)CONCAT44(local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
      }
      if (local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      if (local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
        local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
    if (local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigNum operator +(BigNum a, BigNum b){
    BigNum c = BigNum();
    int rest = 0;
    if (a.sign == b.sign) {
        if (a.length < b.length) {
            for (int i = 0; i < b.length - a.length; i++) {
                a.digits.push_back(0);
            }
            a.length = b.length;
        }
        if (b.length < a.length) {
            for (int i = 0; i < a.length - b.length; i++) {
                b.digits.push_back(0);
            }
            b.length = a.length;
        }
        for (int i = 0; i < a.length; i++) {
            int sum = (a.digits[i] + b.digits[i] + rest) % 10;
            rest = (a.digits[i] + b.digits[i] + rest) / 10;
            c.digits.push_back(sum);
        }
        c.sign = a.sign;
        c.length = a.length;
        if (rest > 0) {
            c.digits.push_back(rest);
            c.length++;
        }
    }
    else {
        if (a.sign){
            c = abs(a) - abs(b);
        }
        else {
            c = abs(b) - abs(a);
        }

    }
    return c;
}